

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O1

int IDARcheck3(IDAMem IDA_mem)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  int *piVar3;
  int *piVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  sunrealtype sVar25;
  
  if (IDA_mem->ida_taskc == 1) {
    uVar10 = -(ulong)((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh < 0.0);
    sVar25 = (sunrealtype)(~uVar10 & (ulong)IDA_mem->ida_tn | (ulong)IDA_mem->ida_toutc & uVar10);
  }
  else {
    if (IDA_mem->ida_taskc != 2) goto LAB_00114a4d;
    sVar25 = IDA_mem->ida_tn;
  }
  IDA_mem->ida_thi = sVar25;
LAB_00114a4d:
  IDAGetSolution(IDA_mem,IDA_mem->ida_thi,IDA_mem->ida_yy,IDA_mem->ida_yp);
  iVar8 = (*IDA_mem->ida_gfun)
                    (IDA_mem->ida_thi,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_ghi,
                     IDA_mem->ida_user_data);
  IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
  iVar14 = -10;
  if (iVar8 == 0) {
    dVar18 = (ABS(IDA_mem->ida_hh) + ABS(IDA_mem->ida_tn)) * IDA_mem->ida_uround * 100.0;
    IDA_mem->ida_ttol = dVar18;
    iVar8 = IDA_mem->ida_nrtfn;
    uVar10 = (ulong)iVar8;
    if ((long)uVar10 < 1) {
      uVar16 = 0;
      bVar6 = true;
      bVar7 = true;
    }
    else {
      uVar12 = 0;
      bVar7 = false;
      bVar6 = false;
      uVar16 = 0;
      dVar22 = 0.0;
      do {
        if (IDA_mem->ida_gactive[uVar12] != 0) {
          dVar21 = IDA_mem->ida_ghi[uVar12];
          if ((dVar21 != 0.0) || (NAN(dVar21))) {
            dVar5 = IDA_mem->ida_glo[uVar12];
            if ((((0.0 < dVar21) && (dVar5 < 0.0)) || ((dVar21 < 0.0 && (0.0 < dVar5)))) &&
               (((double)IDA_mem->ida_rootdir[uVar12] * dVar5 <= 0.0 &&
                (dVar21 = ABS(dVar21 / (dVar21 - dVar5)), dVar22 < dVar21)))) {
              bVar7 = true;
              uVar16 = uVar12 & 0xffffffff;
              dVar22 = dVar21;
            }
          }
          else if ((double)IDA_mem->ida_rootdir[uVar12] * IDA_mem->ida_glo[uVar12] <= 0.0) {
            bVar6 = true;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
      bVar7 = !bVar7;
      bVar6 = !bVar6;
    }
    if (bVar7) {
      IDA_mem->ida_trout = IDA_mem->ida_thi;
      if (0 < iVar8) {
        psVar1 = IDA_mem->ida_ghi;
        psVar2 = IDA_mem->ida_grout;
        uVar16 = 0;
        do {
          psVar2[uVar16] = psVar1[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
      }
      if ((bool)(iVar8 < 1 | bVar6)) {
        uVar9 = (uint)(bVar6 ^ 1);
      }
      else {
        piVar4 = IDA_mem->ida_iroots;
        piVar3 = IDA_mem->ida_gactive;
        lVar13 = 0;
        do {
          piVar4[lVar13] = 0;
          if ((((piVar3[lVar13] != 0) && (IDA_mem->ida_ghi[lVar13] == 0.0)) &&
              (!NAN(IDA_mem->ida_ghi[lVar13]))) &&
             ((double)IDA_mem->ida_rootdir[lVar13] * IDA_mem->ida_glo[lVar13] <= 0.0)) {
            piVar4[lVar13] = (uint)(IDA_mem->ida_glo[lVar13] <= 0.0) * 2 + -1;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < IDA_mem->ida_nrtfn);
        uVar9 = 1;
      }
    }
    else {
      dVar22 = IDA_mem->ida_tlo;
      dVar21 = IDA_mem->ida_thi;
      uVar19 = SUB84(dVar21,0);
      uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
      dVar21 = dVar21 - dVar22;
      dVar5 = ABS(dVar21);
      if (dVar18 < dVar5) {
        dVar24 = 1.0;
        dVar23 = 0.5;
        iVar8 = -1;
        iVar17 = 0;
        do {
          if (iVar8 == iVar17) {
            dVar24 = dVar24 * dVar23;
          }
          else {
            dVar24 = 1.0;
          }
          sVar25 = (double)CONCAT44(uVar20,uVar19) -
                   (dVar21 * IDA_mem->ida_ghi[(int)uVar16]) /
                   (IDA_mem->ida_ghi[(int)uVar16] - IDA_mem->ida_glo[(int)uVar16] * dVar24);
          if (ABS(sVar25 - dVar22) < dVar18 * 0.5) {
            uVar10 = -(ulong)(5.0 < dVar5 / dVar18);
            sVar25 = (double)(uVar10 & 0x3fb999999999999a |
                             ~uVar10 & (ulong)(0.5 / (dVar5 / dVar18))) * dVar21 + dVar22;
          }
          if (ABS((double)CONCAT44(uVar20,uVar19) - sVar25) < dVar18 * 0.5) {
            uVar10 = -(ulong)(5.0 < dVar5 / dVar18);
            sVar25 = (double)(uVar10 & 0xbfb999999999999a |
                             ~uVar10 & (ulong)(-0.5 / (dVar5 / dVar18))) * dVar21 +
                     (double)CONCAT44(uVar20,uVar19);
          }
          IDAGetSolution(IDA_mem,sVar25,IDA_mem->ida_yy,IDA_mem->ida_yp);
          iVar8 = (*IDA_mem->ida_gfun)
                            (sVar25,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_grout,
                             IDA_mem->ida_user_data);
          IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
          if (iVar8 != 0) {
            uVar9 = 0xfffffff6;
            goto LAB_001151f4;
          }
          iVar8 = IDA_mem->ida_nrtfn;
          uVar10 = (ulong)iVar8;
          if ((long)uVar10 < 1) {
            bVar7 = true;
            bVar6 = true;
          }
          else {
            dVar18 = 0.0;
            uVar12 = 0;
            bVar6 = false;
            bVar7 = false;
            do {
              if (IDA_mem->ida_gactive[uVar12] != 0) {
                dVar22 = IDA_mem->ida_grout[uVar12];
                if ((dVar22 != 0.0) || (NAN(dVar22))) {
                  dVar21 = IDA_mem->ida_glo[uVar12];
                  if ((((0.0 < dVar22) && (dVar21 < 0.0)) || ((dVar22 < 0.0 && (0.0 < dVar21)))) &&
                     (((double)IDA_mem->ida_rootdir[uVar12] * dVar21 <= 0.0 &&
                      (dVar22 = ABS(dVar22 / (dVar22 - dVar21)), dVar18 < dVar22)))) {
                    bVar6 = true;
                    uVar16 = uVar12 & 0xffffffff;
                    dVar18 = dVar22;
                  }
                }
                else if ((double)IDA_mem->ida_rootdir[uVar12] * IDA_mem->ida_glo[uVar12] <= 0.0) {
                  bVar7 = true;
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
            bVar6 = !bVar6;
            bVar7 = !bVar7;
          }
          if (bVar6) {
            if (!bVar7) {
              IDA_mem->ida_thi = sVar25;
              if (0 < iVar8) {
                psVar1 = IDA_mem->ida_ghi;
                psVar2 = IDA_mem->ida_grout;
                uVar16 = 0;
                do {
                  psVar1[uVar16] = psVar2[uVar16];
                  uVar16 = uVar16 + 1;
                } while (uVar10 != uVar16);
              }
              break;
            }
            IDA_mem->ida_tlo = sVar25;
            if (0 < iVar8) {
              psVar1 = IDA_mem->ida_glo;
              psVar2 = IDA_mem->ida_grout;
              uVar12 = 0;
              do {
                psVar1[uVar12] = psVar2[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
            iVar11 = 2;
            dVar23 = 2.0;
            if (ABS(IDA_mem->ida_thi - IDA_mem->ida_tlo) <= IDA_mem->ida_ttol) break;
          }
          else {
            IDA_mem->ida_thi = sVar25;
            if (0 < iVar8) {
              psVar1 = IDA_mem->ida_ghi;
              psVar2 = IDA_mem->ida_grout;
              uVar12 = 0;
              do {
                psVar1[uVar12] = psVar2[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
            iVar11 = 1;
            dVar23 = 0.5;
            if (ABS(IDA_mem->ida_thi - IDA_mem->ida_tlo) <= IDA_mem->ida_ttol) break;
          }
          dVar22 = IDA_mem->ida_tlo;
          dVar21 = IDA_mem->ida_thi;
          uVar19 = SUB84(dVar21,0);
          uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
          dVar21 = dVar21 - dVar22;
          dVar5 = ABS(dVar21);
          dVar18 = IDA_mem->ida_ttol;
          iVar8 = iVar17;
          iVar17 = iVar11;
        } while (dVar18 < dVar5);
      }
      IDA_mem->ida_trout = IDA_mem->ida_thi;
      uVar9 = 1;
      if (0 < IDA_mem->ida_nrtfn) {
        piVar4 = IDA_mem->ida_iroots;
        psVar1 = IDA_mem->ida_ghi;
        psVar2 = IDA_mem->ida_grout;
        piVar3 = IDA_mem->ida_gactive;
        lVar13 = 0;
        do {
          psVar2[lVar13] = psVar1[lVar13];
          piVar4[lVar13] = 0;
          if (piVar3[lVar13] != 0) {
            dVar18 = psVar1[lVar13];
            if ((dVar18 == 0.0) &&
               ((double)IDA_mem->ida_rootdir[lVar13] * IDA_mem->ida_glo[lVar13] <= 0.0)) {
              piVar4[lVar13] = (uint)(IDA_mem->ida_glo[lVar13] <= 0.0) * 2 + -1;
            }
            dVar22 = IDA_mem->ida_glo[lVar13];
            if ((((0.0 < dVar18) && (dVar22 < 0.0)) || ((dVar18 < 0.0 && (0.0 < dVar22)))) &&
               ((double)IDA_mem->ida_rootdir[lVar13] * dVar22 <= 0.0)) {
              piVar4[lVar13] = (uint)(dVar22 <= 0.0) * 2 + -1;
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < IDA_mem->ida_nrtfn);
      }
    }
LAB_001151f4:
    if (uVar9 != 0xfffffff6) {
      uVar15 = IDA_mem->ida_nrtfn;
      if (0 < (int)uVar15) {
        piVar4 = IDA_mem->ida_gactive;
        lVar13 = 0;
        do {
          if ((piVar4[lVar13] == 0) &&
             ((IDA_mem->ida_grout[lVar13] != 0.0 || (NAN(IDA_mem->ida_grout[lVar13]))))) {
            piVar4[lVar13] = 1;
          }
          lVar13 = lVar13 + 1;
          uVar15 = IDA_mem->ida_nrtfn;
        } while (lVar13 < (int)uVar15);
      }
      IDA_mem->ida_tlo = IDA_mem->ida_trout;
      if (0 < (int)uVar15) {
        psVar1 = IDA_mem->ida_glo;
        psVar2 = IDA_mem->ida_grout;
        uVar10 = 0;
        do {
          psVar1[uVar10] = psVar2[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar15 != uVar10);
      }
      if (uVar9 == 0) {
        iVar14 = 0;
      }
      else {
        IDAGetSolution(IDA_mem,IDA_mem->ida_trout,IDA_mem->ida_yy,IDA_mem->ida_yp);
        iVar14 = 1;
      }
    }
  }
  return iVar14;
}

Assistant:

static int IDARcheck3(IDAMem IDA_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first. */
  if (IDA_mem->ida_taskc == IDA_ONE_STEP)
  {
    IDA_mem->ida_thi = IDA_mem->ida_tn;
  }
  if (IDA_mem->ida_taskc == IDA_NORMAL)
  {
    IDA_mem->ida_thi =
      ((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh >= ZERO)
        ? IDA_mem->ida_tn
        : IDA_mem->ida_toutc;
  }

  /* Get y and y' at thi. */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_thi, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);

  /* Set ghi = g(thi) and call IDARootfind to search (tlo,thi) for roots. */
  retval = IDA_mem->ida_gfun(IDA_mem->ida_thi, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);
  ier               = IDARootfind(IDA_mem);
  if (ier == IDA_RTFUNC_FAIL) { return (IDA_RTFUNC_FAIL); }
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i] && IDA_mem->ida_grout[i] != ZERO)
    {
      IDA_mem->ida_gactive[i] = SUNTRUE;
    }
  }
  IDA_mem->ida_tlo = IDA_mem->ida_trout;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    IDA_mem->ida_glo[i] = IDA_mem->ida_grout[i];
  }

  /* If no root found, return IDA_SUCCESS. */
  if (ier == IDA_SUCCESS) { return (IDA_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_trout, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);
  return (RTFOUND);
}